

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O2

Vector * Asgn_VV(Vector *V1,Vector *V2)

{
  double dVar1;
  Real *pRVar2;
  Real *pRVar3;
  LASErrIdType LVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  Vector *pVVar9;
  
  V_Lock(V1);
  V_Lock(V2);
  LVar4 = LASResult();
  if (LVar4 == LASOK) {
    if (V1->Instance == Normal) {
      uVar7 = V1->Dim;
      uVar8 = V2->Dim;
      if (uVar7 == uVar8) {
        pRVar2 = V1->Cmp;
        pRVar3 = V2->Cmp;
        pVVar9 = V1;
        if (V2->Instance == Normal) {
          for (uVar8 = 1; uVar8 <= uVar7; uVar8 = uVar8 + 1) {
            pRVar2[uVar8] = pRVar3[uVar8];
          }
        }
        else if (V2->OwnData == False) {
          dVar1 = V2->Multipl;
          uVar8 = 1;
          if (2.220446049250313e-15 <= ABS(dVar1 + -1.0)) {
            for (; uVar8 <= uVar7; uVar8 = uVar8 + 1) {
              pRVar2[uVar8] = pRVar3[uVar8] * dVar1;
            }
          }
          else {
            for (; uVar8 <= uVar7; uVar8 = uVar8 + 1) {
              pRVar2[uVar8] = pRVar3[uVar8];
            }
          }
        }
        else {
          V1->Cmp = pRVar3;
          V2->Cmp = pRVar2;
        }
        goto LAB_00109e37;
      }
    }
    else {
      pcVar5 = V_GetName(V1);
      pcVar6 = V_GetName(V2);
      LASError(LASLValErr,"Asgn_VV",pcVar5,pcVar6,(char *)0x0);
      uVar7 = V1->Dim;
      uVar8 = V2->Dim;
    }
    if (uVar7 != uVar8) {
      pcVar5 = V_GetName(V1);
      pcVar6 = V_GetName(V2);
      LASError(LASDimErr,"Asgn_VV",pcVar5,pcVar6,(char *)0x0);
      pVVar9 = (Vector *)0x0;
      goto LAB_00109e37;
    }
  }
  pVVar9 = (Vector *)0x0;
LAB_00109e37:
  V_Unlock(V1);
  V_Unlock(V2);
  return pVVar9;
}

Assistant:

Vector *Asgn_VV(Vector *V1, Vector *V2)
/* VRes = V1 = V2 */
{
    Vector *VRes;

    double Multipl;
    size_t Dim, Ind;
    Real *V1Cmp, *V2Cmp;

    V_Lock(V1);
    V_Lock(V2);
    
    if (LASResult() == LASOK) {
        if (V1->Instance == Normal && V1->Dim == V2->Dim) {
            V1Cmp = V1->Cmp;
            V2Cmp = V2->Cmp;
            if (V2->Instance == Normal) {
                Dim = V1->Dim;
                for_AllCmp
                    V1Cmp[Ind] = V2Cmp[Ind];
            } else {
                if (V2->OwnData) {
                    V1->Cmp = V2Cmp;
                    V2->Cmp = V1Cmp;
                } else {
                    if (IsOne(V2->Multipl)) {
                        Dim = V1->Dim;
                        for_AllCmp
                            V1Cmp[Ind] = V2Cmp[Ind];
                    } else {
                        Dim = V1->Dim;
                        Multipl = V2->Multipl;
                        for_AllCmp
                            V1Cmp[Ind] = Multipl * V2Cmp[Ind];
                    }
                }
            }
            VRes = V1;
        } else {
            if (V1->Instance != Normal)
                LASError(LASLValErr, "Asgn_VV", V_GetName(V1), V_GetName(V2), NULL);
            if (V1->Dim != V2->Dim)
                LASError(LASDimErr, "Asgn_VV", V_GetName(V1), V_GetName(V2), NULL);
            VRes = NULL;
        }
    } else {
        VRes = NULL;
    }
    
    V_Unlock(V1);
    V_Unlock(V2);

    return(VRes);
}